

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O0

int ndn_unix_client_face_up(ndn_face_intf *self)

{
  long lVar1;
  int iVar2;
  ndn_msg *pnVar3;
  int ret;
  ndn_unix_face_t *ptr;
  ndn_face_intf *self_local;
  
  if (self->state == '\x01') {
    self_local._4_4_ = 0;
  }
  else {
    self_local._4_4_ = ndn_unix_face_up(self);
    if (self_local._4_4_ == 0) {
      iVar2 = connect(*(int *)&self[4].up,(sockaddr *)(self + 1),0x6e);
      if (iVar2 == -1) {
        ndn_face_down(self);
        self_local._4_4_ = 2;
      }
      else {
        pnVar3 = ndn_msgqueue_post(self,ndn_unix_face_recv,0,(void *)0x0);
        *(ndn_msg **)&self[3].face_id = pnVar3;
        lVar1._0_2_ = self[3].face_id;
        lVar1._2_1_ = self[3].state;
        lVar1._3_1_ = self[3].type;
        lVar1._4_4_ = *(undefined4 *)&self[3].field_0x24;
        if (lVar1 == 0) {
          ndn_face_down(self);
          self_local._4_4_ = -0x39;
        }
        else {
          self->state = '\x01';
          self_local._4_4_ = 0;
        }
      }
    }
  }
  return self_local._4_4_;
}

Assistant:

static int
ndn_unix_client_face_up(struct ndn_face_intf* self){
  ndn_unix_face_t* ptr = container_of(self, ndn_unix_face_t, intf);
  int ret = 0;

  if(self->state == NDN_FACE_STATE_UP){
    return NDN_SUCCESS;
  }
  ret = ndn_unix_face_up(self);
  if(ret != NDN_SUCCESS){
    return ret;
  }

  if(connect(ptr->sock, (struct sockaddr*)&ptr->addr, sizeof(ptr->addr)) == -1){
    ndn_face_down(self);
    return NDN_UNIX_FACE_SOCKET_ERROR;
  }

  ptr->process_event = ndn_msgqueue_post(ptr, ndn_unix_face_recv, 0, NULL);
  if(ptr->process_event == NULL){
    ndn_face_down(self);
    return NDN_FWD_MSGQUEUE_FULL;
  }

  self->state = NDN_FACE_STATE_UP;
  return NDN_SUCCESS;
}